

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O0

void __thiscall
portability_path_test_portability_path_test_get_relative_fail_Test::
portability_path_test_portability_path_test_get_relative_fail_Test
          (portability_path_test_portability_path_test_get_relative_fail_Test *this)

{
  portability_path_test *in_RDI;
  
  portability_path_test::portability_path_test(in_RDI);
  (in_RDI->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__portability_path_test_portability_path_test_get_relative_fail_Test_001a6278;
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_get_relative_fail)
{
	static const char base[] = "/this/is/not/shared/with/path";
	static const char path[] = "/a/b/c/abc";
	static const char result[] = "a/b/c/abc";

	string_path relative;

	size_t size = portability_path_get_relative(base, sizeof(base), path, sizeof(path), relative, PATH_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(relative, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}